

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int callback_file_skip(output_file *out,int64_t off)

{
  long *plVar1;
  long in_RSI;
  long in_RDI;
  int ret;
  int to_write;
  output_file_callback *outc;
  long local_30;
  int local_28;
  int local_24;
  long local_20;
  long local_18 [3];
  
  local_20 = in_RDI;
  local_18[0] = in_RSI;
  while( true ) {
    if (local_18[0] < 1) {
      return 0;
    }
    local_30 = 0x7fffffff;
    plVar1 = std::min<long>(local_18,&local_30);
    local_24 = (int)*plVar1;
    local_28 = (**(code **)(local_20 + 0x50))(*(undefined8 *)(local_20 + 0x48),0,(long)local_24);
    if (local_28 < 0) break;
    local_18[0] = local_18[0] - local_24;
  }
  return local_28;
}

Assistant:

static int callback_file_skip(struct output_file* out, int64_t off) {
  struct output_file_callback* outc = to_output_file_callback(out);
  int to_write;
  int ret;

  while (off > 0) {
    to_write = std::min(off, (int64_t)INT_MAX);
    ret = outc->write(outc->priv, nullptr, to_write);
    if (ret < 0) {
      return ret;
    }
    off -= to_write;
  }

  return 0;
}